

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d60_q0_zipcode.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  istream *piVar2;
  reference pLVar3;
  ostream *poVar4;
  Letter *l_1;
  iterator __end1;
  iterator __begin1;
  vector<Letter,_std::allocator<Letter>_> *__range1;
  Letter l;
  undefined1 local_a0 [4];
  int i_1;
  vector<Letter,_std::allocator<Letter>_> letters;
  int n;
  undefined1 local_78 [8];
  ZipInfo z;
  undefined1 local_28 [4];
  int i;
  vector<ZipInfo,_std::allocator<ZipInfo>_> zipinfo;
  int nzip;
  
  zipinfo.super__Vector_base<ZipInfo,_std::allocator<ZipInfo>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  std::istream::operator>>
            ((istream *)&std::cin,
             (int *)&zipinfo.super__Vector_base<ZipInfo,_std::allocator<ZipInfo>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
  std::vector<ZipInfo,_std::allocator<ZipInfo>_>::vector
            ((vector<ZipInfo,_std::allocator<ZipInfo>_> *)local_28);
  for (z._68_4_ = 0;
      (int)z._68_4_ <
      (int)zipinfo.super__Vector_base<ZipInfo,_std::allocator<ZipInfo>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage; z._68_4_ = z._68_4_ + 1) {
    ZipInfo::ZipInfo((ZipInfo *)local_78);
    piVar2 = (istream *)std::istream::operator>>((istream *)&std::cin,(int *)local_78);
    piVar2 = std::operator>>(piVar2,(string *)&z.field_0x20);
    std::operator>>(piVar2,(string *)&z);
    std::vector<ZipInfo,_std::allocator<ZipInfo>_>::push_back
              ((vector<ZipInfo,_std::allocator<ZipInfo>_> *)local_28,(value_type *)local_78);
    ZipInfo::~ZipInfo((ZipInfo *)local_78);
  }
  std::istream::operator>>
            ((istream *)&std::cin,
             (int *)&letters.super__Vector_base<Letter,_std::allocator<Letter>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
  std::vector<Letter,_std::allocator<Letter>_>::vector
            ((vector<Letter,_std::allocator<Letter>_> *)local_a0);
  for (l._132_4_ = 0;
      (int)l._132_4_ <
      (int)letters.super__Vector_base<Letter,_std::allocator<Letter>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage; l._132_4_ = l._132_4_ + 1) {
    Letter::Letter((Letter *)&__range1);
    piVar2 = std::operator>>((istream *)&std::cin,(string *)&__range1);
    piVar2 = std::operator>>(piVar2,(string *)&l.field_0x18);
    piVar2 = std::operator>>(piVar2,(string *)&l.field_0x58);
    piVar2 = std::operator>>(piVar2,(string *)&l.field_0x38);
    std::istream::operator>>(piVar2,(int *)&l.field_0x78);
    std::vector<Letter,_std::allocator<Letter>_>::push_back
              ((vector<Letter,_std::allocator<Letter>_> *)local_a0,(value_type *)&__range1);
    Letter::~Letter((Letter *)&__range1);
  }
  correctZipAndSortLetters
            ((vector<ZipInfo,_std::allocator<ZipInfo>_> *)local_28,
             (vector<Letter,_std::allocator<Letter>_> *)local_a0);
  __end1 = std::vector<Letter,_std::allocator<Letter>_>::begin
                     ((vector<Letter,_std::allocator<Letter>_> *)local_a0);
  l_1 = (Letter *)
        std::vector<Letter,_std::allocator<Letter>_>::end
                  ((vector<Letter,_std::allocator<Letter>_> *)local_a0);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Letter_*,_std::vector<Letter,_std::allocator<Letter>_>_>
                                *)&l_1);
    if (!bVar1) break;
    pLVar3 = __gnu_cxx::__normal_iterator<Letter_*,_std::vector<Letter,_std::allocator<Letter>_>_>::
             operator*(&__end1);
    poVar4 = std::operator<<((ostream *)&std::cout,(string *)pLVar3);
    poVar4 = std::operator<<(poVar4," ");
    poVar4 = std::operator<<(poVar4,(string *)&pLVar3->address);
    poVar4 = std::operator<<(poVar4," ");
    poVar4 = std::operator<<(poVar4,(string *)&pLVar3->district);
    poVar4 = std::operator<<(poVar4," ");
    poVar4 = std::operator<<(poVar4,(string *)&pLVar3->province);
    poVar4 = std::operator<<(poVar4," ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,pLVar3->zip);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::__normal_iterator<Letter_*,_std::vector<Letter,_std::allocator<Letter>_>_>::
    operator++(&__end1);
  }
  std::vector<Letter,_std::allocator<Letter>_>::~vector
            ((vector<Letter,_std::allocator<Letter>_> *)local_a0);
  std::vector<ZipInfo,_std::allocator<ZipInfo>_>::~vector
            ((vector<ZipInfo,_std::allocator<ZipInfo>_> *)local_28);
  return zipinfo.super__Vector_base<ZipInfo,_std::allocator<ZipInfo>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_;
}

Assistant:

int main() {
    int nzip;
    cin >> nzip;
    vector<ZipInfo> zipinfo;
    for (int i = 0; i < nzip; i++) {
        ZipInfo z;
        cin >> z.zip >> z.district >> z.province;
        zipinfo.push_back(z);
    }
    int n;
    cin >> n;
    vector<Letter> letters;
    for (int i = 0; i < n; i++) {
        Letter l;
        cin >> l.name >> l.address >> l.district >> l.province >> l.zip;
        letters.push_back(l);
    }
    correctZipAndSortLetters(zipinfo, letters);
    for (auto &l : letters) {
        cout << l.name << " " << l.address << " " << l.district << " "
             << l.province << " " << l.zip << endl;
    }
}